

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void whereAddLimitExpr(WhereClause *pWC,int iReg,Expr *pExpr,int iCsr,int eMatchOp)

{
  byte *pbVar1;
  Parse *pParse;
  sqlite3 *db;
  WhereTerm *pWVar2;
  int iVar3;
  Expr *pEVar4;
  int iVal;
  
  pParse = pWC->pWInfo->pParse;
  db = pParse->db;
  iVar3 = sqlite3ExprIsInteger(pExpr,&iVal);
  if (iVar3 == 0) {
    pEVar4 = sqlite3Expr(db,0xb0,(char *)0x0);
    if (pEVar4 == (Expr *)0x0) {
      return;
    }
    pEVar4->iTable = iReg;
  }
  else {
    pEVar4 = sqlite3Expr(db,0x9b,(char *)0x0);
    if (pEVar4 == (Expr *)0x0) {
      return;
    }
    pbVar1 = (byte *)((long)&pEVar4->flags + 1);
    *pbVar1 = *pbVar1 | 8;
    (pEVar4->u).iValue = 0;
  }
  pEVar4 = sqlite3PExpr(pParse,0x2e,(Expr *)0x0,pEVar4);
  if (pEVar4 != (Expr *)0x0) {
    iVar3 = whereClauseInsert(pWC,pEVar4,3);
    pWVar2 = pWC->a;
    pWVar2[iVar3].leftCursor = iCsr;
    pWVar2[iVar3].eOperator = 0x40;
    pWVar2[iVar3].eMatchOp = (u8)eMatchOp;
  }
  return;
}

Assistant:

static void whereAddLimitExpr(
  WhereClause *pWC,   /* Add the constraint to this WHERE clause */
  int iReg,           /* Register that will hold value of the limit/offset */
  Expr *pExpr,        /* Expression that defines the limit/offset */
  int iCsr,           /* Cursor to which the constraint applies */
  int eMatchOp        /* SQLITE_INDEX_CONSTRAINT_LIMIT or _OFFSET */
){
  Parse *pParse = pWC->pWInfo->pParse;
  sqlite3 *db = pParse->db;
  Expr *pNew;
  int iVal = 0;

  if( sqlite3ExprIsInteger(pExpr, &iVal) && iVal>=0 ){
    Expr *pVal = sqlite3Expr(db, TK_INTEGER, 0);
    if( pVal==0 ) return;
    ExprSetProperty(pVal, EP_IntValue);
    pVal->u.iValue = iVal;
    pNew = sqlite3PExpr(pParse, TK_MATCH, 0, pVal);
  }else{
    Expr *pVal = sqlite3Expr(db, TK_REGISTER, 0);
    if( pVal==0 ) return;
    pVal->iTable = iReg;
    pNew = sqlite3PExpr(pParse, TK_MATCH, 0, pVal);
  }
  if( pNew ){
    WhereTerm *pTerm;
    int idx;
    idx = whereClauseInsert(pWC, pNew, TERM_DYNAMIC|TERM_VIRTUAL);
    pTerm = &pWC->a[idx];
    pTerm->leftCursor = iCsr;
    pTerm->eOperator = WO_AUX;
    pTerm->eMatchOp = eMatchOp;
  }
}